

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QAbstractItemModelPrivate::Change>::
emplace<QAbstractItemModelPrivate::Change_const&>
          (QMovableArrayOps<QAbstractItemModelPrivate::Change> *this,qsizetype i,Change *args)

{
  Change **ppCVar1;
  qsizetype *pqVar2;
  totally_ordered_wrapper<const_QAbstractItemModel_*> *ptVar3;
  Data *pDVar4;
  long lVar5;
  undefined7 uVar6;
  quintptr qVar7;
  qsizetype qVar8;
  Change *pCVar9;
  long in_FS_OFFSET;
  bool bVar10;
  int iVar11;
  int iVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  int iVar17;
  int iVar18;
  Inserter local_80;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
           super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>))
  goto LAB_003fecfe;
  if ((this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
      super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.size == i) {
    qVar8 = QArrayDataPointer<QAbstractItemModelPrivate::Change>::freeSpaceAtEnd
                      ((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)this);
    if (qVar8 == 0) goto LAB_003fecf5;
    pCVar9 = (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
             super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.ptr;
    lVar5 = (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
            super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.size;
    uVar6 = *(undefined7 *)&args->field_0x21;
    pCVar9[lVar5].needsAdjust = args->needsAdjust;
    *(undefined7 *)&pCVar9[lVar5].field_0x21 = uVar6;
    iVar11 = (args->parent).r;
    iVar12 = (args->parent).c;
    qVar7 = (args->parent).i;
    uVar13 = *(undefined4 *)((long)&(args->parent).i + 4);
    uVar14 = *(undefined4 *)((long)&(args->parent).m.ptr + 4);
    iVar17 = args->first;
    iVar18 = args->last;
    ptVar3 = &pCVar9[lVar5].parent.m;
    *(undefined4 *)&ptVar3->ptr = *(undefined4 *)&(args->parent).m.ptr;
    *(undefined4 *)((long)&ptVar3->ptr + 4) = uVar14;
    *(int *)(ptVar3 + 1) = iVar17;
    *(int *)((long)(ptVar3 + 1) + 4) = iVar18;
    pCVar9 = pCVar9 + lVar5;
    (pCVar9->parent).r = iVar11;
    (pCVar9->parent).c = iVar12;
    *(int *)&(pCVar9->parent).i = (int)qVar7;
    *(undefined4 *)((long)&(pCVar9->parent).i + 4) = uVar13;
  }
  else {
LAB_003fecf5:
    if (i == 0) {
      qVar8 = QArrayDataPointer<QAbstractItemModelPrivate::Change>::freeSpaceAtBegin
                        ((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)this);
      if (qVar8 == 0) goto LAB_003fecfe;
      pCVar9 = (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
               super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.ptr;
      uVar6 = *(undefined7 *)&args->field_0x21;
      pCVar9[-1].needsAdjust = args->needsAdjust;
      *(undefined7 *)&pCVar9[-1].field_0x21 = uVar6;
      iVar11 = (args->parent).r;
      iVar12 = (args->parent).c;
      uVar13 = (undefined4)(args->parent).i;
      uVar14 = *(undefined4 *)((long)&(args->parent).i + 4);
      uVar15 = *(undefined4 *)&(args->parent).m.ptr;
      uVar16 = *(undefined4 *)((long)&(args->parent).m.ptr + 4);
      iVar17 = args->first;
      iVar18 = args->last;
    }
    else {
LAB_003fecfe:
      local_38 = *(undefined8 *)&args->needsAdjust;
      local_58._0_4_ = (args->parent).r;
      local_58._4_4_ = (args->parent).c;
      uStack_50 = (args->parent).i;
      local_48 = (args->parent).m.ptr;
      uStack_40._0_4_ = args->first;
      uStack_40._4_4_ = args->last;
      bVar10 = (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
               super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.size != 0;
      QArrayDataPointer<QAbstractItemModelPrivate::Change>::detachAndGrow
                ((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)this,
                 (uint)(i == 0 && bVar10),1,(Change **)0x0,
                 (QArrayDataPointer<QAbstractItemModelPrivate::Change> *)0x0);
      if (i != 0 || !bVar10) {
        Inserter::Inserter(&local_80,(QArrayDataPointer<QAbstractItemModelPrivate::Change> *)this,i,
                           1);
        *(undefined8 *)&(local_80.displaceFrom)->needsAdjust = local_38;
        *(undefined4 *)&((local_80.displaceFrom)->parent).m.ptr = (undefined4)local_48;
        *(undefined4 *)((long)&((local_80.displaceFrom)->parent).m.ptr + 4) = local_48._4_4_;
        (local_80.displaceFrom)->first = (int)uStack_40;
        (local_80.displaceFrom)->last = uStack_40._4_4_;
        ((local_80.displaceFrom)->parent).r = (int)local_58;
        ((local_80.displaceFrom)->parent).c = local_58._4_4_;
        *(undefined4 *)&((local_80.displaceFrom)->parent).i = (undefined4)uStack_50;
        *(undefined4 *)((long)&((local_80.displaceFrom)->parent).i + 4) = uStack_50._4_4_;
        (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
        goto LAB_003fedae;
      }
      pCVar9 = (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
               super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.ptr;
      *(undefined8 *)&pCVar9[-1].needsAdjust = local_38;
      iVar11 = (int)local_58;
      iVar12 = local_58._4_4_;
      uVar13 = (undefined4)uStack_50;
      uVar14 = uStack_50._4_4_;
      uVar15 = (undefined4)local_48;
      uVar16 = local_48._4_4_;
      iVar17 = (int)uStack_40;
      iVar18 = uStack_40._4_4_;
    }
    *(undefined4 *)&pCVar9[-1].parent.m.ptr = uVar15;
    *(undefined4 *)((long)&pCVar9[-1].parent.m.ptr + 4) = uVar16;
    pCVar9[-1].first = iVar17;
    pCVar9[-1].last = iVar18;
    pCVar9[-1].parent.r = iVar11;
    pCVar9[-1].parent.c = iVar12;
    *(undefined4 *)&pCVar9[-1].parent.i = uVar13;
    *(undefined4 *)((long)&pCVar9[-1].parent.i + 4) = uVar14;
    ppCVar1 = &(this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
               super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.ptr;
    *ppCVar1 = *ppCVar1 + -1;
  }
  pqVar2 = &(this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
            super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.size;
  *pqVar2 = *pqVar2 + 1;
LAB_003fedae:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }